

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

ON_Annotation * __thiscall ON_Annotation::Duplicate(ON_Annotation *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_Annotation *this_local;
  
  iVar1 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[2])();
  return (ON_Annotation *)CONCAT44(extraout_var,iVar1);
}

Assistant:

ON::AnnotationType ON::AnnotationTypeFromUnsigned( 
  unsigned int annotation_type_as_unsigned
)
{
  switch (annotation_type_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Aligned);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Angular);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Diameter);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Radius);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Rotated);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Ordinate);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::ArcLen);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::CenterMark);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Text);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Leader);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Angular3pt);
  }
  ON_ERROR("Invalid annotation_type_as_unsigned parameter");
  return ON::AnnotationType::Unset;
}